

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lev_main.c
# Opt level: O2

int get_object_id(char *s,char c)

{
  char *__s2;
  bool bVar1;
  objclass *poVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  objdescr *poVar6;
  char *pcVar7;
  
  bVar1 = true;
  uVar5 = 0xffffffffffffffff;
  if (c < '\x01') {
    iVar3 = 0;
    uVar5 = 0;
  }
  else {
    iVar3 = def_char_to_objclass(c);
    if (iVar3 == 0) {
      uVar5 = 0;
    }
    else {
      if (iVar3 == 0x12) goto LAB_0010d378;
      uVar5 = (ulong)bases[iVar3];
      bVar1 = false;
    }
  }
  poVar2 = objects;
  pcVar7 = &objects[uVar5].oc_class;
  poVar6 = obj_descr + uVar5;
  for (; (long)uVar5 < 0x21a; uVar5 = uVar5 + 1) {
    if ((!bVar1) && (iVar3 != *pcVar7)) goto LAB_0010d2e0;
    if ((poVar6->oc_name != (char *)0x0) && (iVar4 = strcmp(s,poVar6->oc_name), iVar4 == 0))
    goto LAB_0010d378;
    pcVar7 = pcVar7 + 0x28;
    poVar6 = poVar6 + 1;
  }
  if (bVar1) {
    uVar5 = 0;
  }
  else {
LAB_0010d2e0:
    uVar5 = (ulong)bases[iVar3];
  }
  poVar6 = obj_descr + uVar5;
  for (pcVar7 = &poVar2[uVar5].oc_class; ((long)uVar5 < 0x21a && ((bVar1 || (iVar3 == *pcVar7))));
      pcVar7 = pcVar7 + 0x28) {
    __s2 = poVar6->oc_name;
    if ((__s2 != (char *)0x0) && (iVar4 = strcasecmp(s,__s2), iVar4 == 0)) {
      if (be_verbose != 0) {
        lc_warning("Object type \"%s\" matches \"%s\".",s,__s2);
      }
      uVar5 = uVar5 & 0xffffffff;
      goto LAB_0010d378;
    }
    uVar5 = uVar5 + 1;
    poVar6 = poVar6 + 1;
  }
  uVar5 = 0xffffffffffffffff;
LAB_0010d378:
  return (int)uVar5;
}

Assistant:

int get_object_id(char *s, char c)
{
	int i, class;
	const char *objname;

	class = (c > 0) ? def_char_to_objclass(c) : 0;
	if (class == MAXOCLASSES) return ERR;

	for (i = class ? bases[class] : 0; i < NUM_OBJECTS; i++) {
	    if (class && objects[i].oc_class != class) break;
	    objname = obj_descr[i].oc_name;
	    if (objname && !strcmp(s, objname))
		return i;
	}

	for (i = class ? bases[class] : 0; i < NUM_OBJECTS; i++) {
	    if (class && objects[i].oc_class != class) break;
	    objname = obj_descr[i].oc_name;
	    if (objname && !strcasecmp(s, objname)) {
		if (be_verbose)
		    lc_warning("Object type \"%s\" matches \"%s\".", s, objname);
		return i;
	    }
	}

	return ERR;
}